

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

void host_init_cold_5(void)

{
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x61);
  fwrite("SDL_CreateWindow failed.\n",0x19,1,_stderr);
  return;
}

Assistant:

static Result host_init_video(Host* host) {
  Emulator* e = host_get_emulator(host);
  SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 3);
  SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 2);
  SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_CORE);
  int width = host->init.use_sgb_border ? SGB_SCREEN_WIDTH : SCREEN_WIDTH;
  int height = host->init.use_sgb_border ? SGB_SCREEN_HEIGHT : SCREEN_HEIGHT;

  host->window = SDL_CreateWindow(
      "binjgb", SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED,
      width * host->init.render_scale, height * host->init.render_scale,
      SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
  CHECK_MSG(host->window != NULL, "SDL_CreateWindow failed.\n");

  host->gl_context = SDL_GL_CreateContext(host->window);
  SDL_GL_SetSwapInterval(1);
  GLint major;
  SDL_GL_GetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, &major);
  CHECK_MSG(major >= 2, "Unable to create GL context at version 2.\n");
  host_gl_init_procs();

  host->ui = host_ui_new(host->window, host->init.use_sgb_border);
  host->fb_texture = host_create_texture(host, SCREEN_WIDTH, SCREEN_HEIGHT,
                                         HOST_TEXTURE_FORMAT_RGBA);
  if (host->init.use_sgb_border) {
    host->sgb_fb_texture = host_create_texture(
        host, SGB_SCREEN_WIDTH, SGB_SCREEN_HEIGHT, HOST_TEXTURE_FORMAT_RGBA);
  }
  return OK;
error:
  SDL_Quit();
  return ERROR;
}